

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O3

void handleEvents(double *timeout)

{
  _GLFWcursor *p_Var1;
  wl_cursor *pwVar2;
  bool bVar3;
  int iVar4;
  GLFWbool GVar5;
  ssize_t sVar6;
  _GLFWwindow *p_Var7;
  long lVar8;
  pollfd fds [4];
  uint64_t repeats;
  pollfd local_58;
  int local_50;
  uint local_4c;
  int local_48;
  undefined8 local_44;
  uint local_3c;
  long local_38;
  
  if (_glfw.joysticksInitialized != 0) {
    _glfwDetectJoystickConnectionLinux();
  }
  local_58.fd = (*_glfw.wl.client.display_get_fd)(_glfw.wl.display);
  local_58.events = 1;
  local_58.revents = 0;
  local_50 = _glfw.wl.keyRepeatTimerfd;
  local_4c = 1;
  local_48 = _glfw.wl.cursorTimerfd;
  local_44 = 0xffffffff00000001;
  local_3c = 1;
  if (_glfw.wl.libdecor.context != (libdecor *)0x0) {
    iVar4 = (*_glfw.wl.libdecor.libdecor_get_fd_)(_glfw.wl.libdecor.context);
    local_44 = CONCAT44(iVar4,(undefined4)local_44);
  }
  while( true ) {
    while (iVar4 = (*_glfw.wl.client.display_prepare_read)(_glfw.wl.display), iVar4 != 0) {
      iVar4 = (*_glfw.wl.client.display_dispatch_pending)(_glfw.wl.display);
      if (0 < iVar4) {
        return;
      }
    }
    GVar5 = flushDisplay();
    if (GVar5 == 0) {
      (*_glfw.wl.client.display_cancel_read)(_glfw.wl.display);
      for (p_Var7 = _glfw.windowListHead; p_Var7 != (_GLFWwindow *)0x0; p_Var7 = p_Var7->next) {
        _glfwInputWindowCloseRequest(p_Var7);
      }
      return;
    }
    GVar5 = _glfwPollPOSIX(&local_58,4,timeout);
    if (GVar5 == 0) {
      (*_glfw.wl.client.display_cancel_read)(_glfw.wl.display);
      return;
    }
    if ((local_58._4_4_ & 0x10000) == 0) {
      (*_glfw.wl.client.display_cancel_read)(_glfw.wl.display);
      bVar3 = false;
    }
    else {
      (*_glfw.wl.client.display_read_events)(_glfw.wl.display);
      iVar4 = (*_glfw.wl.client.display_dispatch_pending)(_glfw.wl.display);
      bVar3 = 0 < iVar4;
    }
    if (((local_4c & 0x10000) != 0) &&
       (sVar6 = read(_glfw.wl.keyRepeatTimerfd,&local_38,8), sVar6 == 8)) {
      lVar8 = local_38;
      if (local_38 == 0) {
        bVar3 = true;
      }
      else {
        do {
          iVar4 = -1;
          if ((ulong)(uint)_glfw.wl.keyRepeatScancode < 0x100) {
            iVar4 = (int)_glfw.wl.keycodes[(uint)_glfw.wl.keyRepeatScancode];
          }
          bVar3 = true;
          _glfwInputKey(_glfw.wl.keyboardFocus,iVar4,_glfw.wl.keyRepeatScancode,1,
                        _glfw.wl.xkb.modifiers);
          inputText(_glfw.wl.keyboardFocus,_glfw.wl.keyRepeatScancode);
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
    }
    if ((((((local_44 & 0x10000) != 0) &&
          (sVar6 = read(_glfw.wl.cursorTimerfd,&local_38,8), p_Var7 = _glfw.wl.pointerFocus,
          sVar6 == 8)) && (_glfw.wl.pointerFocus != (_GLFWwindow *)0x0)) &&
        ((((_glfw.wl.pointerFocus)->wl).hovered != 0 &&
         (p_Var1 = ((_glfw.wl.pointerFocus)->wl).currentCursor, p_Var1 != (_GLFWcursor *)0x0)))) &&
       (pwVar2 = (p_Var1->wl).cursor, pwVar2 != (wl_cursor *)0x0)) {
      (p_Var1->wl).currentImage = ((p_Var1->wl).currentImage + 1U) % pwVar2->image_count;
      setCursorImage(p_Var7,&p_Var1->wl);
    }
    if (((local_3c & 0x10000) != 0) &&
       (iVar4 = (*_glfw.wl.libdecor.libdecor_dispatch_)(_glfw.wl.libdecor.context,0), 0 < iVar4))
    break;
    if (bVar3) {
      return;
    }
  }
  return;
}

Assistant:

static void handleEvents(double* timeout)
{
#if defined(GLFW_BUILD_LINUX_JOYSTICK)
    if (_glfw.joysticksInitialized)
        _glfwDetectJoystickConnectionLinux();
#endif

    GLFWbool event = GLFW_FALSE;
    enum { DISPLAY_FD, KEYREPEAT_FD, CURSOR_FD, LIBDECOR_FD };
    struct pollfd fds[] =
    {
        [DISPLAY_FD] = { wl_display_get_fd(_glfw.wl.display), POLLIN },
        [KEYREPEAT_FD] = { _glfw.wl.keyRepeatTimerfd, POLLIN },
        [CURSOR_FD] = { _glfw.wl.cursorTimerfd, POLLIN },
        [LIBDECOR_FD] = { -1, POLLIN }
    };

    if (_glfw.wl.libdecor.context)
        fds[LIBDECOR_FD].fd = libdecor_get_fd(_glfw.wl.libdecor.context);

    while (!event)
    {
        while (wl_display_prepare_read(_glfw.wl.display) != 0)
        {
            if (wl_display_dispatch_pending(_glfw.wl.display) > 0)
                return;
        }

        // If an error other than EAGAIN happens, we have likely been disconnected
        // from the Wayland session; try to handle that the best we can.
        if (!flushDisplay())
        {
            wl_display_cancel_read(_glfw.wl.display);

            _GLFWwindow* window = _glfw.windowListHead;
            while (window)
            {
                _glfwInputWindowCloseRequest(window);
                window = window->next;
            }

            return;
        }

        if (!_glfwPollPOSIX(fds, sizeof(fds) / sizeof(fds[0]), timeout))
        {
            wl_display_cancel_read(_glfw.wl.display);
            return;
        }

        if (fds[DISPLAY_FD].revents & POLLIN)
        {
            wl_display_read_events(_glfw.wl.display);
            if (wl_display_dispatch_pending(_glfw.wl.display) > 0)
                event = GLFW_TRUE;
        }
        else
            wl_display_cancel_read(_glfw.wl.display);

        if (fds[KEYREPEAT_FD].revents & POLLIN)
        {
            uint64_t repeats;

            if (read(_glfw.wl.keyRepeatTimerfd, &repeats, sizeof(repeats)) == 8)
            {
                for (uint64_t i = 0; i < repeats; i++)
                {
                    _glfwInputKey(_glfw.wl.keyboardFocus,
                                  translateKey(_glfw.wl.keyRepeatScancode),
                                  _glfw.wl.keyRepeatScancode,
                                  GLFW_PRESS,
                                  _glfw.wl.xkb.modifiers);
                    inputText(_glfw.wl.keyboardFocus, _glfw.wl.keyRepeatScancode);
                }

                event = GLFW_TRUE;
            }
        }

        if (fds[CURSOR_FD].revents & POLLIN)
        {
            uint64_t repeats;

            if (read(_glfw.wl.cursorTimerfd, &repeats, sizeof(repeats)) == 8)
                incrementCursorImage(_glfw.wl.pointerFocus);
        }

        if (fds[LIBDECOR_FD].revents & POLLIN)
        {
            if (libdecor_dispatch(_glfw.wl.libdecor.context, 0) > 0)
                event = GLFW_TRUE;
        }
    }
}